

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_router_session.c
# Opt level: O0

dlep_router_session *
dlep_router_add_session(dlep_router_if *interf,netaddr_socket *local,netaddr_socket *remote)

{
  list_entity *plVar1;
  list_entity *plVar2;
  oonf_log_source oVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  oonf_stream_session *poVar7;
  avl_tree *paVar8;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  netaddr_str nbuf2;
  netaddr_str nbuf1;
  dlep_extension *ext;
  dlep_router_session *router_session;
  netaddr_socket *remote_local;
  netaddr_socket *local_local;
  dlep_router_if *interf_local;
  
  interf_local = (dlep_router_if *)dlep_router_get_session(interf,remote);
  oVar3 = LOG_DLEP_ROUTER;
  if (interf_local == (dlep_router_if *)0x0) {
    interf_local = (dlep_router_if *)oonf_class_malloc(&_router_session_class);
    if (interf_local == (dlep_router_if *)0x0) {
      interf_local = (dlep_router_if *)0x0;
    }
    else {
      memcpy((void *)((long)&(interf_local->interf).udp.socket_v4.local_socket + 0x10),remote,0x80);
      (interf_local->interf).udp.multicast_v4.scheduler_entry._node.prev =
           (list_entity *)((long)&(interf_local->interf).udp.socket_v4.local_socket + 0x10);
      (interf_local->interf).session.local_neighbor_tree.count = 120000;
      (interf_local->interf).session.local_neighbor_tree.allow_dups = false;
      *(undefined3 *)&(interf_local->interf).session.local_neighbor_tree.field_0x1d = 0;
      (interf_local->interf).session.local_neighbor_tree.comp =
           (_func_int_void_ptr_void_ptr *)0x1000;
      *(undefined4 *)&(interf_local->interf).session.local_neighbor_tree.root = 3;
      (interf_local->interf).session.cb_end_session = _cb_tcp_lost;
      (interf_local->interf).session.cb_destination_timeout = _cb_socket_terminated;
      (interf_local->interf).session.l2_listener.name = (char *)_cb_tcp_receive_data;
      oVar3 = LOG_DLEP_ROUTER;
      if (((&log_global_mask)[LOG_DLEP_ROUTER] & 1) != 0) {
        uVar5 = netaddr_socket_to_string(nbuf2.buf + 0x36,local);
        uVar6 = netaddr_socket_to_string((long)&__tempptr + 4,remote);
        oonf_log(1,oVar3,"src/generic/dlep/router/dlep_router_session.c",0x95,0,0,
                 "Connect DLEP session from %s to %s",uVar5,uVar6);
      }
      iVar4 = oonf_stream_add((oonf_stream_socket *)
                              &(interf_local->interf).session.cfg.discovery_interval,local);
      oVar3 = LOG_DLEP_ROUTER;
      if (iVar4 == 0) {
        poVar7 = (oonf_stream_session *)
                 oonf_stream_connect_to
                           ((oonf_stream_socket *)
                            &(interf_local->interf).session.cfg.discovery_interval,remote);
        (interf_local->interf).session.cfg.peer_type = (char *)poVar7;
        oVar3 = LOG_DLEP_ROUTER;
        if ((oonf_stream_session *)(interf_local->interf).session.cfg.peer_type ==
            (oonf_stream_session *)0x0) {
          if (((&log_global_mask)[LOG_DLEP_ROUTER] & 4) != 0) {
            uVar5 = netaddr_socket_to_string(nbuf2.buf + 0x36,local);
            uVar6 = netaddr_socket_to_string((long)&__tempptr + 4,remote);
            oonf_log(4,oVar3,"src/generic/dlep/router/dlep_router_session.c",0xa2,0,0,
                     "Could not open TCP client on from %s to %s",uVar5,uVar6);
          }
          dlep_router_remove_session((dlep_router_session *)interf_local);
          interf_local = (dlep_router_if *)0x0;
        }
        else {
          iVar4 = dlep_session_add((dlep_session *)
                                   &(interf_local->interf).session.local_event_timer.class,
                                   (interf->interf).l2_ifname,(interf->interf).session.l2_origin,
                                   (interf->interf).session.l2_default_origin,
                                   &((oonf_stream_session *)
                                    (interf_local->interf).session.cfg.peer_type)->out,false,
                                   (_func_int_os_interface_listener_ptr *)0x0,LOG_DLEP_ROUTER);
          if (iVar4 == 0) {
            *(undefined4 *)&(interf_local->interf).session.local_event_timer._clock = 2;
            (interf_local->interf).session._ack_timeout._node.list.prev =
                 (list_entity *)_cb_send_buffer;
            (interf_local->interf).session._ack_timeout._node.parent = (avl_node *)_cb_end_session;
            (interf_local->interf).session.local_event_timer.class =
                 (oonf_timer_class *)(interf->interf).session.cfg.peer_type;
            *(uint64_t *)&(interf_local->interf).session.local_event_timer.jitter_pct =
                 (interf->interf).session.cfg.discovery_interval;
            (interf_local->interf).session.local_event_timer._period =
                 (interf->interf).session.cfg.heartbeat_interval;
            *(undefined8 *)&(interf_local->interf).session.local_event_timer._random =
                 *(undefined8 *)&(interf->interf).session.cfg.send_neighbors;
            *(dlep_router_if **)&(interf_local->interf).udp.multicast_v4.scheduler_entry.fd = interf
            ;
            avl_insert(&(interf->interf).session_tree,
                       &(interf_local->interf).udp.multicast_v4.scheduler_entry.fd.received_events);
            paVar8 = dlep_extension_get_tree();
            for (plVar1 = (paVar8->list_head).next; plVar2 = plVar1->prev,
                paVar8 = dlep_extension_get_tree(), plVar2 != (paVar8->list_head).prev;
                plVar1 = plVar1->next) {
              if (plVar1[-4].prev != (list_entity *)0x0) {
                (*(code *)plVar1[-4].prev)(&(interf_local->interf).session.local_event_timer.class);
              }
            }
          }
          else {
            dlep_router_remove_session((dlep_router_session *)interf_local);
            interf_local = (dlep_router_if *)0x0;
          }
        }
      }
      else {
        if (((&log_global_mask)[LOG_DLEP_ROUTER] & 4) != 0) {
          uVar5 = netaddr_socket_to_string(nbuf2.buf + 0x36,local);
          oonf_log(4,oVar3,"src/generic/dlep/router/dlep_router_session.c",0x99,0,0,
                   "Could not open TCP client for local address %s",uVar5);
        }
        dlep_router_remove_session((dlep_router_session *)interf_local);
        interf_local = (dlep_router_if *)0x0;
      }
    }
  }
  else if (((&log_global_mask)[LOG_DLEP_ROUTER] & 1) != 0) {
    uVar5 = netaddr_socket_to_string(nbuf2.buf + 0x36,remote);
    oonf_log(1,oVar3,"src/generic/dlep/router/dlep_router_session.c",0x7e,0,0,
             "use existing instance on %s for %s",(interf->interf).l2_ifname,uVar5);
  }
  return (dlep_router_session *)interf_local;
}

Assistant:

struct dlep_router_session *
dlep_router_add_session(struct dlep_router_if *interf, union netaddr_socket *local, union netaddr_socket *remote) {
  struct dlep_router_session *router_session;
  struct dlep_extension *ext;
  struct netaddr_str nbuf1, nbuf2;

  router_session = dlep_router_get_session(interf, remote);
  if (router_session) {
    OONF_DEBUG(LOG_DLEP_ROUTER,
      "use existing instance on"
      " %s for %s",
      interf->interf.l2_ifname, netaddr_socket_to_string(&nbuf1, remote));
    return router_session;
  }

  /* initialize tcp session instance */
  router_session = oonf_class_malloc(&_router_session_class);
  if (!router_session) {
    return NULL;
  }

  /* initialize tree node */
  memcpy(&router_session->session.remote_socket, remote, sizeof(*remote));
  router_session->_node.key = &router_session->session.remote_socket;

  /* configure and open TCP session */
  router_session->tcp.config.session_timeout = 120000; /* 120 seconds */
  router_session->tcp.config.maximum_input_buffer = 4096;
  router_session->tcp.config.allowed_sessions = 3;
  router_session->tcp.config.cleanup_session = _cb_tcp_lost;
  router_session->tcp.config.cleanup_socket = _cb_socket_terminated;
  router_session->tcp.config.receive_data = _cb_tcp_receive_data;

  OONF_DEBUG(LOG_DLEP_ROUTER, "Connect DLEP session from %s to %s", netaddr_socket_to_string(&nbuf1, local),
    netaddr_socket_to_string(&nbuf2, remote));

  if (oonf_stream_add(&router_session->tcp, local)) {
    OONF_WARN(
      LOG_DLEP_ROUTER, "Could not open TCP client for local address %s", netaddr_socket_to_string(&nbuf1, local));
    dlep_router_remove_session(router_session);
    return NULL;
  }

  /* open stream */
  router_session->stream = oonf_stream_connect_to(&router_session->tcp, remote);
  if (!router_session->stream) {
    OONF_WARN(LOG_DLEP_ROUTER, "Could not open TCP client on from %s to %s", netaddr_socket_to_string(&nbuf1, local),
      netaddr_socket_to_string(&nbuf2, remote));
    dlep_router_remove_session(router_session);
    return NULL;
  }

  if (dlep_session_add(&router_session->session, interf->interf.l2_ifname, interf->interf.session.l2_origin,
        interf->interf.session.l2_default_origin, &router_session->stream->out, false, NULL, LOG_DLEP_ROUTER)) {
    dlep_router_remove_session(router_session);
    return NULL;
  }
  router_session->session.restrict_signal = DLEP_SESSION_INITIALIZATION_ACK;
  router_session->session.cb_send_buffer = _cb_send_buffer;
  router_session->session.cb_end_session = _cb_end_session;
  memcpy(&router_session->session.cfg, &interf->interf.session.cfg, sizeof(router_session->session.cfg));

  /* initialize back pointer */
  router_session->interface = interf;

  /* add session to interface */
  avl_insert(&interf->interf.session_tree, &router_session->_node);

  /* inform all extensions */
  avl_for_each_element(dlep_extension_get_tree(), ext, _node) {
    if (ext->cb_session_init_router) {
      ext->cb_session_init_router(&router_session->session);
    }
  }

  return router_session;
}